

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  RepeatedField<int> *pRVar1;
  bool bVar2;
  CppType CVar3;
  LogMessage *pLVar4;
  LogFinisher local_61;
  LogMessage local_60;
  Extension *extension;
  
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
    return;
  }
  bVar2 = MaybeNewExtension(this,number,descriptor,&extension);
  if (bVar2) {
    extension->type = type;
    CVar3 = anon_unknown_0::cpp_type(type);
    if (CVar3 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x1ef);
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    extension->is_repeated = false;
    extension->field_0xa = extension->field_0xa & 0xf;
  }
  else {
    if (extension->is_repeated != false) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,500);
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    CVar3 = anon_unknown_0::cpp_type(extension->type);
    if (CVar3 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,500);
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    pRVar1 = (extension->field_0).repeated_int32_value;
    if ((extension->field_0xa & 0x10) != 0) {
      (**(code **)(pRVar1->elements_ + 10))(pRVar1,message);
      goto LAB_00206ac2;
    }
    if (pRVar1 != (RepeatedField<int> *)0x0) {
      (**(code **)(pRVar1->elements_ + 2))();
    }
  }
  (extension->field_0).message_value = message;
LAB_00206ac2:
  extension->field_0xa = extension->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == NULL) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = message;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message);
    } else {
      delete extension->message_value;
      extension->message_value = message;
    }
  }
  extension->is_cleared = false;
}